

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O1

void S_ChannelEnded(FISoundChannel *ichan)

{
  uint uVar1;
  uint uVar2;
  FSoundChan *schan;
  bool bVar3;
  
  if (ichan == (FISoundChannel *)0x0) {
    return;
  }
  if (((uint)ichan[1].DistanceScale & 4) == 0) {
    if (((uint)ichan[1].DistanceScale & 0x102) == 0) {
      uVar1 = (*GSnd->_vptr_SoundRenderer[0x13])(GSnd,ichan);
      uVar2 = (*GSnd->_vptr_SoundRenderer[9])
                        (GSnd,S_sfx.Array[ichan[1].Rolloff.RolloffType].data.data);
      if (uVar1 == 0) {
        bVar3 = (bool)((*(byte *)((long)&ichan[1].DistanceScale + 1) & 2) >> 1);
      }
      else {
        bVar3 = uVar1 < uVar2;
      }
      if (bVar3 == false) goto LAB_002fcf1e;
    }
    *(byte *)&ichan[1].DistanceScale = *(byte *)&ichan[1].DistanceScale | 2;
    ichan->SysChannel = (void *)0x0;
  }
  else {
LAB_002fcf1e:
    *(void **)ichan[1].StartTime = ichan[1].SysChannel;
    if (ichan[1].SysChannel != (void *)0x0) {
      *(QWORD_UNION *)((long)ichan[1].SysChannel + 0x30) = ichan[1].StartTime;
    }
    ichan[2].SysChannel = (void *)0x0;
    ichan[2].StartTime.AsOne = 0;
    *(undefined8 *)&ichan[1].Rolloff.field_2 = 0;
    ichan[1].DistanceSqr = 0.0;
    ichan[1].ManualRolloff = false;
    *(undefined3 *)&ichan[1].field_0x25 = 0;
    ichan[1].StartTime.AsOne = 0;
    ichan[1].Rolloff.RolloffType = 0;
    ichan[1].Rolloff.MinDistance = 0.0;
    ichan->DistanceSqr = 0.0;
    ichan->ManualRolloff = false;
    *(undefined3 *)&ichan->field_0x25 = 0;
    ichan[1].SysChannel = (void *)0x0;
    (ichan->Rolloff).RolloffType = 0;
    (ichan->Rolloff).MinDistance = 0.0;
    *(undefined8 *)&(ichan->Rolloff).field_2 = 0;
    ichan->SysChannel = (void *)0x0;
    (ichan->StartTime).AsOne = 0;
    ichan[2].Rolloff.RolloffType = 0;
    ichan[2].Rolloff.MinDistance = 0.0;
    ichan[1].SysChannel = FreeChannels;
    if (FreeChannels != (FSoundChan *)0x0) {
      FreeChannels->PrevChan = (FSoundChan **)(ichan + 1);
    }
    FreeChannels = (FSoundChan *)ichan;
    ichan[1].StartTime.AsOne = (QWORD)&FreeChannels;
  }
  return;
}

Assistant:

void S_ChannelEnded(FISoundChannel *ichan)
{
	FSoundChan *schan = static_cast<FSoundChan*>(ichan);
	bool evicted;

	if (schan != NULL)
	{
		// If the sound was stopped with GSnd->StopSound(), then we know
		// it wasn't evicted. Otherwise, if it's looping, it must have
		// been evicted. If it's not looping, then it was evicted if it
		// didn't reach the end of its playback.
		if (schan->ChanFlags & CHAN_FORGETTABLE)
		{
			evicted = false;
		}
		else if (schan->ChanFlags & (CHAN_LOOP | CHAN_EVICTED))
		{
			evicted = true;
		}
		else
		{ 
			unsigned int pos = GSnd->GetPosition(schan);
			unsigned int len = GSnd->GetSampleLength(S_sfx[schan->SoundID].data);
			if (pos == 0)
			{
				evicted = !!(schan->ChanFlags & CHAN_JUSTSTARTED);
			}
			else
			{
				evicted = (pos < len);
			}
		}
		if (!evicted)
		{
			S_ReturnChannel(schan);
		}
		else
		{
			schan->ChanFlags |= CHAN_EVICTED;
			schan->SysChannel = NULL;
		}
	}
}